

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demux.c
# Opt level: O3

ParseStatus ParseSingleImage(WebPDemuxer *dmux)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  Frame *pFVar5;
  ParseStatus PVar6;
  Frame *frame;
  MemBuffer *mem;
  
  if (dmux->frames != (Frame *)0x0) {
    return PARSE_ERROR;
  }
  sVar4 = (dmux->mem).start;
  if (7 < (dmux->mem).riff_end - sVar4) {
    if ((dmux->mem).end - sVar4 < 8) {
      return PARSE_NEED_MORE_DATA;
    }
    frame = (Frame *)WebPSafeCalloc(1,0x50);
    if (frame != (Frame *)0x0) {
      PVar6 = StoreFrame(1,0,&dmux->mem,frame);
      if (PVar6 != PARSE_ERROR) {
        uVar1 = dmux->feature_flags;
        if (((uVar1 & 0x10) == 0) && (frame->img_components[1].size != 0)) {
          frame->has_alpha = 0;
          frame->img_components[1].offset = 0;
          frame->img_components[1].size = 0;
        }
        if (((dmux->is_ext_format == 0) && (iVar2 = frame->width, 0 < iVar2)) &&
           (iVar3 = frame->height, 0 < iVar3)) {
          dmux->state = WEBP_DEMUX_PARSED_HEADER;
          dmux->canvas_width = iVar2;
          dmux->canvas_height = iVar3;
          dmux->feature_flags = (uint)(frame->has_alpha != 0) << 4 | uVar1;
        }
        pFVar5 = *dmux->frames_tail;
        if ((pFVar5 == (Frame *)0x0) || (pFVar5->complete != 0)) {
          *dmux->frames_tail = frame;
          frame->next = (Frame *)0x0;
          dmux->frames_tail = &frame->next;
          dmux->num_frames = 1;
          return PVar6;
        }
      }
      WebPSafeFree(frame);
    }
  }
  return PARSE_ERROR;
}

Assistant:

static ParseStatus ParseSingleImage(WebPDemuxer* const dmux) {
  const size_t min_size = CHUNK_HEADER_SIZE;
  MemBuffer* const mem = &dmux->mem;
  Frame* frame;
  ParseStatus status;
  int image_added = 0;

  if (dmux->frames != NULL) return PARSE_ERROR;
  if (SizeIsInvalid(mem, min_size)) return PARSE_ERROR;
  if (MemDataSize(mem) < min_size) return PARSE_NEED_MORE_DATA;

  frame = (Frame*)WebPSafeCalloc(1ULL, sizeof(*frame));
  if (frame == NULL) return PARSE_ERROR;

  // For the single image case we allow parsing of a partial frame, so no
  // minimum size is imposed here.
  status = StoreFrame(1, 0, &dmux->mem, frame);
  if (status != PARSE_ERROR) {
    const int has_alpha = !!(dmux->feature_flags & ALPHA_FLAG);
    // Clear any alpha when the alpha flag is missing.
    if (!has_alpha && frame->img_components[1].size > 0) {
      frame->img_components[1].offset = 0;
      frame->img_components[1].size = 0;
      frame->has_alpha = 0;
    }

    // Use the frame width/height as the canvas values for non-vp8x files.
    // Also, set ALPHA_FLAG if this is a lossless image with alpha.
    if (!dmux->is_ext_format && frame->width > 0 && frame->height > 0) {
      dmux->state = WEBP_DEMUX_PARSED_HEADER;
      dmux->canvas_width = frame->width;
      dmux->canvas_height = frame->height;
      dmux->feature_flags |= frame->has_alpha ? ALPHA_FLAG : 0;
    }
    if (!AddFrame(dmux, frame)) {
      status = PARSE_ERROR;  // last frame was left incomplete
    } else {
      image_added = 1;
      dmux->num_frames = 1;
    }
  }

  if (!image_added) WebPSafeFree(frame);
  return status;
}